

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTrFunc.cpp
# Opt level: O0

NaTransFunc * __thiscall NaTransFunc::operator+=(NaTransFunc *this,NaTransFunc *tf)

{
  NaTransFunc **obj;
  long in_RSI;
  NaTransFunc *in_RDI;
  NaTransFunc *tf_tmp;
  NaTransFunc **in_stack_fffffffffffffea8;
  NaDynAr<NaTransFunc_*> *in_stack_fffffffffffffeb0;
  NaDynAr<NaTransFunc_*> *this_00;
  NaTransFunc *in_stack_fffffffffffffee8;
  NaTransFunc *in_stack_fffffffffffffef0;
  NaTransFunc *in_stack_ffffffffffffff20;
  NaTransFunc *in_stack_ffffffffffffff28;
  
  if ((in_RDI->ut == utSum) && (*(int *)(in_RSI + 0x40) == 0)) {
    (*(in_RDI->super_NaUnit).super_NaLogging._vptr_NaLogging[0x13])(in_RDI,in_RSI);
  }
  else if ((in_RDI->ut == utSum) && (*(int *)(in_RSI + 0x40) != 0)) {
    this_00 = &in_RDI->items;
    operator_new(0x108);
    NaTransFunc(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    NaDynAr<NaTransFunc_*>::addh(this_00,in_stack_fffffffffffffea8);
  }
  else if ((in_RDI->ut == utSum) || (*(int *)(in_RSI + 0x40) != 0)) {
    operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    ~NaTransFunc(in_RDI);
  }
  else {
    obj = (NaTransFunc **)operator_new(0x108);
    NaTransFunc(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    NaDynAr<NaTransFunc_*>::addl(in_stack_fffffffffffffeb0,obj);
  }
  return in_RDI;
}

Assistant:

NaTransFunc&
NaTransFunc::operator+= (const NaTransFunc& tf)
{
    if(utSum == ut && utSum == tf.ut){
        CopyItems(tf);
    }else if(utSum == ut && utSum != tf.ut){
        items.addh(new NaTransFunc(tf));
    }else if(utSum != ut && utSum == tf.ut){
        NaTransFunc *tf_tmp = new NaTransFunc(*this);
        *this = tf;
        items.addl(tf_tmp);
    }else{ //if(utSum != ut && utSum != tf.ut)
        *this = *this + tf;
    }

    return *this;
}